

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O1

Maybe<unsigned_long> __thiscall
kj::HashIndex<kj::HashMap<kj::ReadableDirectory_const*,kj::String>::Callbacks>::
insert<kj::HashMap<kj::ReadableDirectory_const*,kj::String>::Entry,kj::ReadableDirectory_const*&>
          (HashIndex<kj::HashMap<kj::ReadableDirectory_const*,kj::String>::Callbacks> *this,
          ArrayPtr<kj::HashMap<const_kj::ReadableDirectory_*,_kj::String>::Entry> table,size_t pos,
          ReadableDirectory **params)

{
  uint uVar1;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar2;
  ulong uVar3;
  uint uVar4;
  size_t sVar5;
  HashBucket *pHVar6;
  int iVar7;
  uint hash;
  HashIndex<kj::HashMap<const_kj::ReadableDirectory_*,_kj::String>::Callbacks> *this_00;
  ulong targetSize;
  long *in_R9;
  HashBucket *pHVar8;
  int iVar9;
  Maybe<unsigned_long> MVar10;
  
  this_00 = (HashIndex<kj::HashMap<const_kj::ReadableDirectory_*,_kj::String>::Callbacks> *)
            table.ptr;
  uVar3 = (this_00->buckets).size_ * 2;
  if (uVar3 < (this_00->erasedCount + pos) * 3 + 3) {
    targetSize = pos * 2 + 2;
    if (targetSize < uVar3) {
      targetSize = uVar3;
    }
    HashIndex<kj::HashMap<const_kj::ReadableDirectory_*,_kj::String>::Callbacks>::rehash
              (this_00,targetSize);
  }
  iVar7 = (int)((ulong)*in_R9 >> 0x20) * 0xbfe3;
  iVar9 = -(int)*in_R9;
  hash = (uint)(iVar7 != iVar9);
  uVar4 = kj::_::chooseBucket(hash,(uint)(this_00->buckets).size_);
  aVar2 = (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2)(this_00->buckets).ptr;
  pHVar6 = (HashBucket *)0x0;
  do {
    pHVar8 = (HashBucket *)(aVar2.value + (ulong)uVar4 * 8);
    uVar1 = pHVar8->value;
    if (uVar1 == 1) {
      if (pHVar6 == (HashBucket *)0x0) {
        pHVar6 = pHVar8;
      }
    }
    else {
      if (uVar1 == 0) {
        if (pHVar6 != (HashBucket *)0x0) {
          this_00->erasedCount = this_00->erasedCount - 1;
          pHVar8 = pHVar6;
        }
        *pHVar8 = (HashBucket)(((ulong)(iVar7 != iVar9) | (long)params << 0x20) + 0x200000000);
        *this = (HashIndex<kj::HashMap<kj::ReadableDirectory_const*,kj::String>::Callbacks>)0x0;
        goto LAB_00196b4e;
      }
      if ((pHVar8->hash == hash) && (*(long *)(table.size_ + (ulong)(uVar1 - 2) * 0x20) == *in_R9))
      {
        *this = (HashIndex<kj::HashMap<kj::ReadableDirectory_const*,kj::String>::Callbacks>)0x1;
        *(ulong *)(this + 8) = (ulong)(uVar1 - 2);
LAB_00196b4e:
        MVar10.ptr.field_1.value = aVar2.value;
        MVar10.ptr._0_8_ = this;
        return (Maybe<unsigned_long>)MVar10.ptr;
      }
    }
    sVar5 = (ulong)uVar4 + 1;
    uVar4 = (uint)sVar5;
    if (sVar5 == (this_00->buckets).size_) {
      uVar4 = 0;
    }
  } while( true );
}

Assistant:

kj::Maybe<size_t> insert(kj::ArrayPtr<Row> table, size_t pos, Params&&... params) {
    if (buckets.size() * 2 < (table.size() + 1 + erasedCount) * 3) {
      // Load factor is more than 2/3, let's rehash.
      rehash(kj::max(buckets.size() * 2, (table.size() + 1) * 2));
    }

    uint hashCode = cb.hashCode(params...);
    Maybe<_::HashBucket&> erasedSlot;
    for (uint i = _::chooseBucket(hashCode, buckets.size());; i = _::probeHash(buckets, i)) {
      auto& bucket = buckets[i];
      if (bucket.isEmpty()) {
        // no duplicates found
        KJ_IF_MAYBE(s, erasedSlot) {
          --erasedCount;
          *s = { hashCode, uint(pos) };
        } else {
          bucket = { hashCode, uint(pos) };
        }
        return nullptr;
      } else if (bucket.isErased()) {
        // We can fill in the erased slot. However, we have to keep searching to make sure there
        // are no duplicates before we do that.
        if (erasedSlot == nullptr) {
          erasedSlot = bucket;
        }
      } else if (bucket.hash == hashCode &&
                 cb.matches(bucket.getRow(table), params...)) {
        // duplicate row
        return size_t(bucket.getPos());
      }
    }